

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O1

void __thiscall fineftp::FtpSession::handleFtpCommandFEAT(FtpSession *this,string *param_1)

{
  stringstream ss;
  string local_1b8;
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_198);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_188,"211- Feature List:\r\n",0x14);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_188," UTF8\r\n",7);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_188," SIZE\r\n",7);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_188," LANG EN\r\n",10);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_188,"211 END\r\n",9);
  ::std::__cxx11::stringbuf::str();
  sendRawFtpMessage(this,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::stringstream::~stringstream(local_198);
  ::std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void FtpSession::handleFtpCommandFEAT(const std::string& /*param*/)
  {
    std::stringstream ss;
    ss << "211- Feature List:\r\n";
    ss << " UTF8\r\n";
    ss << " SIZE\r\n";
    ss << " LANG EN\r\n";
    ss << "211 END\r\n";

    sendRawFtpMessage(ss.str());
  }